

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

AddLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_add(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xe6) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xe6;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    AddLayerParams::AddLayerParams(this_00.add_);
    (this->layer_).add_ = (AddLayerParams *)this_00;
  }
  return (AddLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::AddLayerParams* NeuralNetworkLayer::mutable_add() {
  if (!has_add()) {
    clear_layer();
    set_has_add();
    layer_.add_ = new ::CoreML::Specification::AddLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.add)
  return layer_.add_;
}